

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qformlayout.cpp
# Opt level: O0

void QFormLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QFlagsStorage<Qt::AlignmentFlag> *pQVar2;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar3;
  QFlagsStorage<Qt::AlignmentFlag> QVar4;
  QFormLayout *pQVar5;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QFormLayout *_t;
  QFormLayout *in_stack_ffffffffffffff98;
  QFormLayout *in_stack_ffffffffffffffa0;
  QFormLayout *in_stack_ffffffffffffffa8;
  QFormLayout *in_stack_ffffffffffffffb0;
  Alignment alignment;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    pQVar2 = (QFlagsStorage<Qt::AlignmentFlag> *)*in_RCX;
    in_stack_ffffffffffffffb0 = (QFormLayout *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffffb0) {
    case (QFormLayout *)0x0:
      QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)fieldGrowthPolicy(in_stack_ffffffffffffff98);
      pQVar2->i = (Int)QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i;
      break;
    case (QFormLayout *)0x1:
      QVar4.i = rowWrapPolicy(in_stack_ffffffffffffff98);
      pQVar2->i = QVar4.i;
      break;
    case (QFormLayout *)0x2:
      QVar4.i = (Int)labelAlignment(in_stack_ffffffffffffffa0);
      pQVar2->i = QVar4.i;
      break;
    case (QFormLayout *)0x3:
      QVar4.i = (Int)formAlignment(in_stack_ffffffffffffffa0);
      pQVar2->i = QVar4.i;
      break;
    case (QFormLayout *)0x4:
      QVar4.i = horizontalSpacing(in_stack_ffffffffffffffa8);
      pQVar2->i = QVar4.i;
      break;
    case (QFormLayout *)0x5:
      QVar4.i = verticalSpacing(in_stack_ffffffffffffffa8);
      pQVar2->i = QVar4.i;
    }
  }
  if (in_ESI == 2) {
    pQVar5 = (QFormLayout *)(ulong)in_EDX;
    alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>
    .i = SUB84((ulong)*in_RCX >> 0x20,0);
    switch(pQVar5) {
    case (QFormLayout *)0x0:
      setFieldGrowthPolicy(in_stack_ffffffffffffffb0,FieldsStayAtSizeHint);
      break;
    case (QFormLayout *)0x1:
      setRowWrapPolicy(in_stack_ffffffffffffffb0,DontWrapRows);
      break;
    case (QFormLayout *)0x2:
      setLabelAlignment(pQVar5,alignment);
      break;
    case (QFormLayout *)0x3:
      setFormAlignment(pQVar5,alignment);
      break;
    case (QFormLayout *)0x4:
      setHorizontalSpacing(in_stack_ffffffffffffffb0,0);
      break;
    case (QFormLayout *)0x5:
      setVerticalSpacing(in_stack_ffffffffffffffb0,0);
    }
  }
  if (in_ESI == 3) {
    pQVar5 = (QFormLayout *)(ulong)in_EDX;
    switch(pQVar5) {
    case (QFormLayout *)0x0:
      resetFieldGrowthPolicy(pQVar5);
      break;
    case (QFormLayout *)0x1:
      resetRowWrapPolicy(pQVar5);
      break;
    case (QFormLayout *)0x2:
      resetLabelAlignment(pQVar5);
      break;
    case (QFormLayout *)0x3:
      resetFormAlignment(pQVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFormLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFormLayout *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<FieldGrowthPolicy*>(_v) = _t->fieldGrowthPolicy(); break;
        case 1: *reinterpret_cast<RowWrapPolicy*>(_v) = _t->rowWrapPolicy(); break;
        case 2: *reinterpret_cast<Qt::Alignment*>(_v) = _t->labelAlignment(); break;
        case 3: *reinterpret_cast<Qt::Alignment*>(_v) = _t->formAlignment(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->horizontalSpacing(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->verticalSpacing(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFieldGrowthPolicy(*reinterpret_cast<FieldGrowthPolicy*>(_v)); break;
        case 1: _t->setRowWrapPolicy(*reinterpret_cast<RowWrapPolicy*>(_v)); break;
        case 2: _t->setLabelAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 3: _t->setFormAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 4: _t->setHorizontalSpacing(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setVerticalSpacing(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 0: _t->resetFieldGrowthPolicy(); break;
        case 1: _t->resetRowWrapPolicy(); break;
        case 2: _t->resetLabelAlignment(); break;
        case 3: _t->resetFormAlignment(); break;
        default: break;
        }
    }
}